

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10310e3::BlendA64Mask1DTestHBD_RandomValues_Test::TestBody
          (BlendA64Mask1DTestHBD_RandomValues_Test *this)

{
  int iVar1;
  ACMRandom *in_RDI;
  int i_1;
  int i;
  int hi;
  int bsize;
  int in_stack_0000005c;
  BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
  *in_stack_00000060;
  int in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  int local_c;
  
  in_RDI[0x28056].random_.state_ = 8;
  while ((int)in_RDI[0x28056].random_.state_ < 0xd) {
    for (local_c = 0; local_c < 0x16; local_c = local_c + 1) {
      for (local_14 = 0; local_14 < 0x14000; local_14 = local_14 + 1) {
        iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
        *(short *)((long)&in_RDI[0xe].random_.state_ + (long)local_14 * 2) = (short)iVar1;
        iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
        *(short *)((long)&in_RDI[0xa00e].random_.state_ + (long)local_14 * 2) = (short)iVar1;
        iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
        *(short *)((long)&in_RDI[0x14010].random_.state_ + (long)local_14 * 2) = (short)iVar1;
        iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
        *(short *)((long)&in_RDI[0x1e012].random_.state_ + (long)local_14 * 2) = (short)iVar1;
      }
      for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
        iVar1 = libaom_test::ACMRandom::operator()(in_RDI,in_stack_ffffffffffffffdc);
        *(char *)((long)&in_RDI[0x28014].random_.state_ + (long)local_18) = (char)iVar1;
      }
      BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
      ::Common(in_stack_00000060,in_stack_0000005c);
    }
    in_RDI[0x28056].random_.state_ = in_RDI[0x28056].random_.state_ + 2;
  }
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTestHBD, RandomValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      const int hi = 1 << bit_depth_;

      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_(hi);
        dst_tst_[i] = rng_(hi);
        src0_[i] = rng_(hi);
        src1_[i] = rng_(hi);
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      Common(bsize);
    }
  }
}